

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O1

void __thiscall
Assimp::DXFImporter::ParseEntities(DXFImporter *this,LineReader *reader,FileData *output)

{
  pointer pBVar1;
  int iVar2;
  Logger *this_00;
  LineReader *pLVar3;
  LineReader *pLVar4;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [8];
  pointer psStack_1a0;
  pointer local_198;
  vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_> vStack_190;
  _Alloc_hider local_178;
  size_type sStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 local_158 [32];
  ios_base local_138 [264];
  
  local_168._8_8_ = 0;
  vStack_190.super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_190.super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198 = (pointer)0x0;
  vStack_190.super__Vector_base<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8 = (undefined1  [8])0x0;
  psStack_1a0 = (pointer)0x0;
  sStack_170 = 0;
  local_168._M_allocated_capacity = 0;
  local_158._0_4_ = 0.0;
  local_158._4_4_ = 0.0;
  local_158._8_8_ = 0;
  local_178._M_p = (pointer)&local_168;
  std::vector<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>::
  emplace_back<Assimp::DXF::Block>(&output->blocks,(Block *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
  }
  std::vector<Assimp::DXF::InsertBlock,_std::allocator<Assimp::DXF::InsertBlock>_>::~vector
            (&vStack_190);
  std::
  vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
  ::~vector((vector<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
             *)local_1a8);
  pBVar1 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::_M_replace
            ((ulong)&pBVar1[-1].name,0,(char *)pBVar1[-1].name._M_string_length,0x6e059f);
  iVar2 = reader->end;
  while (iVar2 < 2) {
    if (reader->groupcode == 0) {
      iVar2 = strcmp("ENDSEC",(reader->value)._M_dataplus._M_p);
      if (iVar2 == 0) break;
      iVar2 = strcmp("POLYLINE",(reader->value)._M_dataplus._M_p);
      if (iVar2 == 0) {
        pLVar4 = DXF::LineReader::operator++(reader);
        ParsePolyLine(this,pLVar4,output);
      }
      else {
        iVar2 = strcmp("INSERT",(reader->value)._M_dataplus._M_p);
        if (iVar2 == 0) {
          pLVar4 = reader;
          pLVar3 = DXF::LineReader::operator++(reader);
          ParseInsertion((DXFImporter *)pLVar4,pLVar3,output);
        }
        else {
          iVar2 = strcmp("3DFACE",(reader->value)._M_dataplus._M_p);
          if (((iVar2 != 0) && (iVar2 = strcmp("LINE",(reader->value)._M_dataplus._M_p), iVar2 != 0)
              ) && (iVar2 = strcmp("3DLINE",(reader->value)._M_dataplus._M_p), iVar2 != 0))
          goto LAB_004477da;
          pLVar4 = reader;
          pLVar3 = DXF::LineReader::operator++(reader);
          Parse3DFace((DXFImporter *)pLVar4,pLVar3,output);
        }
      }
    }
    else {
LAB_004477da:
      DXF::LineReader::operator++(reader);
    }
    iVar2 = reader->end;
  }
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[10]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [10])"DXF: got ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," polylines and ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," inserted blocks in ENTITIES",0x1c);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void DXFImporter::ParseEntities(DXF::LineReader& reader, DXF::FileData& output) {
    // Push a new block onto the stack.
    output.blocks.push_back( DXF::Block() );
    DXF::Block& block = output.blocks.back();

    block.name = AI_DXF_ENTITIES_MAGIC_BLOCK;

    while( !reader.End() && !reader.Is(0,"ENDSEC")) {
        if (reader.Is(0,"POLYLINE")) {
            ParsePolyLine(++reader,output);
            continue;
        }

        else if (reader.Is(0,"INSERT")) {
            ParseInsertion(++reader,output);
            continue;
        }

        else if (reader.Is(0,"3DFACE") || reader.Is(0,"LINE") || reader.Is(0,"3DLINE")) {
            //http://sourceforge.net/tracker/index.php?func=detail&aid=2970566&group_id=226462&atid=1067632
            Parse3DFace(++reader, output);
            continue;
        }

        ++reader;
    }

    ASSIMP_LOG_DEBUG_F( "DXF: got ", block.lines.size()," polylines and ", block.insertions.size(), 
        " inserted blocks in ENTITIES" );
}